

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int get_sqr_bsize_idx(BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_local;
  int local_4;
  
  switch(bsize) {
  case BLOCK_4X4:
    local_4 = 0;
    break;
  default:
    local_4 = 6;
    break;
  case BLOCK_8X8:
    local_4 = 1;
    break;
  case BLOCK_16X16:
    local_4 = 2;
    break;
  case BLOCK_32X32:
    local_4 = 3;
    break;
  case BLOCK_64X64:
    local_4 = 4;
    break;
  case BLOCK_128X128:
    local_4 = 5;
  }
  return local_4;
}

Assistant:

static inline int get_sqr_bsize_idx(BLOCK_SIZE bsize) {
  switch (bsize) {
    case BLOCK_4X4: return 0;
    case BLOCK_8X8: return 1;
    case BLOCK_16X16: return 2;
    case BLOCK_32X32: return 3;
    case BLOCK_64X64: return 4;
    case BLOCK_128X128: return 5;
    default: return SQR_BLOCK_SIZES;
  }
}